

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O1

base_learner * OjaNewton_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  double dVar3;
  vw *pvVar4;
  int iVar5;
  OjaNewton *__s;
  option_group_definition *poVar6;
  typed_option<int> *ptVar7;
  typed_option<float> *ptVar8;
  float *pfVar9;
  float **ppfVar10;
  ulong uVar11;
  example **ppeVar12;
  learner<OjaNewton,_example> *plVar13;
  uint32_t *puVar14;
  long lVar15;
  free_ptr<OjaNewton> ON;
  bool oja_newton;
  float alpha_inverse;
  string random_init;
  string normalize;
  option_group_definition new_options;
  free_ptr<OjaNewton> local_ce8;
  bool local_cd5;
  float local_cd4;
  vw *local_cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  string local_c88;
  string local_c68;
  undefined1 *local_c48 [2];
  undefined1 local_c38 [16];
  string local_c28;
  undefined1 *local_c08 [2];
  undefined1 local_bf8 [16];
  string local_be8;
  undefined1 *local_bc8 [2];
  undefined1 local_bb8 [16];
  string local_ba8;
  undefined1 *local_b88 [2];
  undefined1 local_b78 [16];
  string local_b68;
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  string local_b28;
  undefined1 *local_b08;
  long local_b00;
  undefined1 local_af8 [16];
  option_group_definition local_ae8;
  undefined1 *local_ab0 [2];
  undefined1 local_aa0 [16];
  string local_a90;
  undefined1 *local_a70 [2];
  undefined1 local_a60 [16];
  undefined1 *local_a50 [2];
  undefined1 local_a40 [16];
  undefined1 local_a30 [112];
  bool local_9c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  undefined1 local_990 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  undefined1 local_8f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  undefined1 local_850 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_710;
  typed_option<float> local_670;
  typed_option<float> local_5d0;
  typed_option<float> local_530;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<int> local_350;
  typed_option<int> local_2b0;
  typed_option<int> local_210;
  typed_option<int> local_170;
  typed_option<bool> local_d0;
  
  __s = calloc_or_throw<OjaNewton>(1);
  memset(__s,0,0xb0);
  local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<OjaNewton>;
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>.
  _M_head_impl = __s;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ca8,"true","");
  local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"true","");
  local_b08 = local_af8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b08,"OjaNewton options","");
  local_ae8.m_name._M_dataplus._M_p = (pointer)&local_ae8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_ae8,local_b08,local_b08 + local_b00);
  local_ae8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ae8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ae8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_b08 != local_af8) {
    operator_delete(local_b08);
  }
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b28,"OjaNewton","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_a30,&local_b28,&local_cd5);
  local_9c0 = true;
  local_b48[0] = local_b38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b48,"Online Newton with Oja\'s Sketch","");
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_a30);
  poVar6 = VW::config::option_group_definition::add<bool>(&local_ae8,&local_d0);
  local_b68._M_dataplus._M_p = (pointer)&local_b68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b68,"sketch_size","");
  VW::config::typed_option<int>::typed_option
            (&local_210,&local_b68,
             &(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m);
  ptVar7 = VW::config::typed_option<int>::default_value(&local_210,10);
  local_b88[0] = local_b78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"size of sketch","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_170,ptVar7);
  poVar6 = VW::config::option_group_definition::add<int>(poVar6,&local_170);
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba8,"epoch_size","");
  VW::config::typed_option<int>::typed_option
            (&local_350,&local_ba8,
             &(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size);
  ptVar7 = VW::config::typed_option<int>::default_value(&local_350,1);
  local_bc8[0] = local_bb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bc8,"size of epoch","");
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<int>::typed_option(&local_2b0,ptVar7);
  poVar6 = VW::config::option_group_definition::add<int>(poVar6,&local_2b0);
  local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_be8,"alpha","");
  VW::config::typed_option<float>::typed_option
            (&local_490,&local_be8,
             &(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->alpha);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_490,1.0);
  local_c08[0] = local_bf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c08,"mutiplicative constant for indentiy","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3f0,ptVar8);
  poVar6 = VW::config::option_group_definition::add<float>(poVar6,&local_3f0);
  local_c28._M_dataplus._M_p = (pointer)&local_c28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c28,"alpha_inverse","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_850,&local_c28,&local_cd4);
  local_c48[0] = local_c38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c48,"one over alpha, similar to learning rate","");
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_530,(typed_option<float> *)local_850);
  poVar6 = VW::config::option_group_definition::add<float>(poVar6,&local_530);
  local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c68,"learning_rate_cnt","");
  VW::config::typed_option<float>::typed_option
            (&local_670,&local_c68,
             &(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->learning_rate_cnt);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_670,2.0);
  local_a50[0] = local_a40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a50,"constant for the learning rate 1/t","");
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_5d0,ptVar8);
  poVar6 = VW::config::option_group_definition::add<float>(poVar6,&local_5d0);
  local_c88._M_dataplus._M_p = (pointer)&local_c88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"normalize","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_8f0,&local_c88,&local_ca8);
  local_a70[0] = local_a60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a70,"normalize the features or not","");
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_710,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_8f0);
  poVar6 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar6,&local_710);
  local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"random_init","");
  local_cd0 = all;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990,&local_a90,&local_cc8);
  local_ab0[0] = local_aa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ab0,"randomize initialization of Oja or not","");
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_7b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar6,&local_7b0);
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb018;
  if (local_7b0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_7b0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_ab0[0] != local_aa0) {
    operator_delete(local_ab0[0]);
  }
  local_990._0_8_ = &PTR__typed_option_002cb018;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
    operator_delete(local_a90._M_dataplus._M_p);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb018;
  if (local_710.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_710.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_a70[0] != local_a60) {
    operator_delete(local_a70[0]);
  }
  local_8f0._0_8_ = &PTR__typed_option_002cb018;
  if (local_858._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_858._M_pi);
  }
  if (local_868._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_868._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c88._M_dataplus._M_p != &local_c88.field_2) {
    operator_delete(local_c88._M_dataplus._M_p);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_a50[0] != local_a40) {
    operator_delete(local_a50[0]);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_c48[0] != local_c38) {
    operator_delete(local_c48[0]);
  }
  local_850._0_8_ = &PTR__typed_option_002cb0f8;
  if (local_7b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b8._M_pi);
  }
  if (local_7c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_850);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c28._M_dataplus._M_p != &local_c28.field_2) {
    operator_delete(local_c28._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_c08[0] != local_bf8) {
    operator_delete(local_c08[0]);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
    operator_delete(local_be8._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb998;
  if (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_bc8[0] != local_bb8) {
    operator_delete(local_bc8[0]);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb998;
  if (local_350.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb998;
  if (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_b88[0] != local_b78) {
    operator_delete(local_b88[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb998;
  if (local_210.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b68._M_dataplus._M_p != &local_b68.field_2) {
    operator_delete(local_b68._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_b48[0] != local_b38) {
    operator_delete(local_b48[0]);
  }
  local_a30._0_8_ = &PTR__typed_option_002cafb0;
  if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
  }
  if (local_9a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_ae8);
  pvVar4 = local_cd0;
  pp_Var1 = (_func_int **)(local_a30 + 0x10);
  local_a30._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"OjaNewton","");
  iVar5 = (*options->_vptr_options_i[1])(options,local_a30);
  if ((_func_int **)local_a30._0_8_ != pp_Var1) {
    operator_delete((void *)local_a30._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar13 = (learner<OjaNewton,_example> *)0x0;
  }
  else {
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->all = pvVar4;
    iVar5 = std::__cxx11::string::compare((char *)&local_ca8);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->normalize = iVar5 == 0;
    iVar5 = std::__cxx11::string::compare((char *)&local_cc8);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->random_init = iVar5 == 0;
    local_a30._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"alpha_inverse","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_a30);
    if ((_func_int **)local_a30._0_8_ != pp_Var1) {
      operator_delete((void *)local_a30._0_8_);
    }
    if ((char)iVar5 != '\0') {
      (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->alpha = 1.0 / local_cd4;
    }
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->cnt = 0;
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->t = 1;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->ev = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->b = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->D = pfVar9;
    ppfVar10 = calloc_or_throw<float*>
                         ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                                 _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->A = ppfVar10;
    ppfVar10 = calloc_or_throw<float*>
                         ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                                 _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->K = ppfVar10;
    uVar11 = (ulong)(uint)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m;
    if (0 < (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m) {
      lVar15 = 0;
      do {
        pfVar9 = calloc_or_throw<float>((long)((int)uVar11 + 1));
        (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->A[lVar15 + 1] = pfVar9;
        pfVar9 = calloc_or_throw<float>
                           ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>
                                   ._M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                   super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
        (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->K[lVar15 + 1] = pfVar9;
        (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->A[lVar15 + 1][lVar15 + 1] = 1.0;
        (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->K[lVar15 + 1][lVar15 + 1] = 1.0;
        (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->D[lVar15 + 1] = 1.0;
        uVar11 = (ulong)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m;
        lVar15 = lVar15 + 1;
      } while (lVar15 < (long)uVar11);
    }
    ppeVar12 = calloc_or_throw<example*>
                         ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                                 _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                                 super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size
                         );
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->buffer = ppeVar12;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->epoch_size);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->weight_buffer = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->zv = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->vv = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.super__Head_base<0UL,_OjaNewton_*,_false>
    ._M_head_impl)->tmp = pfVar9;
    ((local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).ON =
         local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).Zx = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).AZx = pfVar9;
    pfVar9 = calloc_or_throw<float>
                       ((long)(local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>.
                               _M_t.super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 1);
    ((local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->data).delta = pfVar9;
    dVar3 = log2((double)((local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl)->m + 2));
    dVar3 = ceil(dVar3);
    if ((pvVar4->weights).sparse == true) {
      sparse_parameters::stride_shift(&(pvVar4->weights).sparse_weights,(uint32_t)(long)dVar3);
    }
    else {
      (pvVar4->weights).dense_weights._stride_shift = (uint32_t)(long)dVar3;
    }
    puVar14 = &(pvVar4->weights).dense_weights._stride_shift;
    if ((pvVar4->weights).sparse != false) {
      puVar14 = &(pvVar4->weights).sparse_weights._stride_shift;
    }
    plVar13 = LEARNER::init_learner<OjaNewton,example,LEARNER::learner<char,char>>
                        (&local_ce8,learn,predict,(ulong)(uint)(1 << ((byte)*puVar14 & 0x1f)));
    *(code **)(plVar13 + 0x80) = save_load;
    uVar2 = *(undefined8 *)(plVar13 + 0x18);
    *(undefined8 *)(plVar13 + 0x70) = uVar2;
    *(undefined8 *)(plVar13 + 0x78) = *(undefined8 *)(plVar13 + 0x20);
    *(undefined8 *)(plVar13 + 0x58) = uVar2;
    *(code **)(plVar13 + 0x68) = keep_example;
    *(undefined8 *)(plVar13 + 0xb8) = uVar2;
    *(undefined8 *)(plVar13 + 0xc0) = *(undefined8 *)(plVar13 + 0x20);
    *(code **)(plVar13 + 200) = finish;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_ae8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8.m_name._M_dataplus._M_p != &local_ae8.m_name.field_2) {
    operator_delete(local_ae8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p);
  }
  if (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl != (OjaNewton *)0x0) {
    (*(code *)local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_ce8._M_t.super___uniq_ptr_impl<OjaNewton,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_OjaNewton_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_OjaNewton_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar13;
}

Assistant:

base_learner* OjaNewton_setup(options_i& options, vw& all)
{
  auto ON = scoped_calloc_or_throw<OjaNewton>();

  bool oja_newton;
  float alpha_inverse;

  // These two are the only two boolean options that default to true. For now going to do this hack
  // as the infrastructure doesn't easily support this possibility at the same time providing the
  // ease of bool switches elsewhere. It seems that the switch behavior is more critical because
  // of the positional data argument.
  std::string normalize = "true";
  std::string random_init = "true";
  option_group_definition new_options("OjaNewton options");
  new_options.add(make_option("OjaNewton", oja_newton).keep().help("Online Newton with Oja's Sketch"))
      .add(make_option("sketch_size", ON->m).default_value(10).help("size of sketch"))
      .add(make_option("epoch_size", ON->epoch_size).default_value(1).help("size of epoch"))
      .add(make_option("alpha", ON->alpha).default_value(1.f).help("mutiplicative constant for indentiy"))
      .add(make_option("alpha_inverse", alpha_inverse).help("one over alpha, similar to learning rate"))
      .add(make_option("learning_rate_cnt", ON->learning_rate_cnt)
               .default_value(2.f)
               .help("constant for the learning rate 1/t"))
      .add(make_option("normalize", normalize).help("normalize the features or not"))
      .add(make_option("random_init", random_init).help("randomize initialization of Oja or not"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("OjaNewton"))
    return nullptr;

  ON->all = &all;

  ON->normalize = normalize == "true";
  ON->random_init = random_init == "true";

  if (options.was_supplied("alpha_inverse"))
    ON->alpha = 1.f / alpha_inverse;

  ON->cnt = 0;
  ON->t = 1;
  ON->ev = calloc_or_throw<float>(ON->m + 1);
  ON->b = calloc_or_throw<float>(ON->m + 1);
  ON->D = calloc_or_throw<float>(ON->m + 1);
  ON->A = calloc_or_throw<float*>(ON->m + 1);
  ON->K = calloc_or_throw<float*>(ON->m + 1);
  for (int i = 1; i <= ON->m; i++)
  {
    ON->A[i] = calloc_or_throw<float>(ON->m + 1);
    ON->K[i] = calloc_or_throw<float>(ON->m + 1);
    ON->A[i][i] = 1;
    ON->K[i][i] = 1;
    ON->D[i] = 1;
  }

  ON->buffer = calloc_or_throw<example*>(ON->epoch_size);
  ON->weight_buffer = calloc_or_throw<float>(ON->epoch_size);

  ON->zv = calloc_or_throw<float>(ON->m + 1);
  ON->vv = calloc_or_throw<float>(ON->m + 1);
  ON->tmp = calloc_or_throw<float>(ON->m + 1);

  ON->data.ON = ON.get();
  ON->data.Zx = calloc_or_throw<float>(ON->m + 1);
  ON->data.AZx = calloc_or_throw<float>(ON->m + 1);
  ON->data.delta = calloc_or_throw<float>(ON->m + 1);

  all.weights.stride_shift((uint32_t)ceil(log2(ON->m + 2)));

  learner<OjaNewton, example>& l = init_learner(ON, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_finish_example(keep_example);
  l.set_finish(finish);
  return make_base(l);
}